

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_auth_xoauth2_resp(connectdata *conn,int imapcode,imapstate instate)

{
  char *local_38;
  char *xoauth;
  size_t len;
  SessionHandle *data;
  imapstate local_18;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  len = (size_t)conn->data;
  xoauth = (char *)0x0;
  local_38 = (char *)0x0;
  local_18 = instate;
  result = imapcode;
  _instate_local = conn;
  if (imapcode == 0x2b) {
    data._4_4_ = Curl_sasl_create_xoauth2_message
                           (conn->data,conn->user,conn->xoauth2_bearer,&local_38,(size_t *)&xoauth);
    if (((data._4_4_ == CURLE_OK) && (local_38 != (char *)0x0)) &&
       (data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s",local_38),
       data._4_4_ == CURLE_OK)) {
      state(_instate_local,IMAP_AUTHENTICATE_FINAL);
    }
  }
  else {
    Curl_failf((SessionHandle *)len,"Access denied: %d",(ulong)(uint)imapcode);
    data._4_4_ = CURLE_LOGIN_DENIED;
  }
  if (local_38 != (char *)0x0) {
    (*Curl_cfree)(local_38);
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_state_auth_xoauth2_resp(struct connectdata *conn,
                                             int imapcode,
                                             imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  size_t len = 0;
  char *xoauth = NULL;

  (void)instate; /* no use for this yet */

  if(imapcode != '+') {
    failf(data, "Access denied: %d", imapcode);
    result = CURLE_LOGIN_DENIED;
  }
  else {
    /* Create the authorisation message */
    result = Curl_sasl_create_xoauth2_message(conn->data, conn->user,
                                              conn->xoauth2_bearer,
                                              &xoauth, &len);
    if(!result && xoauth) {
      /* Send the message */
      result = Curl_pp_sendf(&conn->proto.imapc.pp, "%s", xoauth);

      if(!result)
        state(conn, IMAP_AUTHENTICATE_FINAL);
    }
  }

  Curl_safefree(xoauth);

  return result;
}